

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_lower_upper_factorisation.hpp
# Opt level: O2

bool __thiscall
Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::factorise
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this,
          Matrix_Dense<double,_0UL,_0UL> *a_matrix)

{
  Matrix_Dense<double,_0UL,_0UL> *this_00;
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  pointer pVVar4;
  size_t i_column_sweep;
  ulong uVar5;
  ulong uVar6;
  pointer pVVar7;
  ulong uVar8;
  
  this->factorised = false;
  this_00 = &this->lu_factorised;
  std::vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>::
  operator=(&this_00->
             super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
            ,&a_matrix->
              super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           );
  pVVar4 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar7 = (this->lu_factorised).
           super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           .
           super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  while (uVar8 = uVar2, uVar2 = ((long)pVVar7 - (long)pVVar4) / 0x18, uVar8 < uVar2) {
    if (ABS(*(double *)
             (*(long *)&pVVar4[uVar8].super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_> + uVar8 * 8)) <
        this->factorisation_tolerance) goto LAB_0010c0c8;
    uVar2 = uVar8 + 1;
    for (uVar6 = uVar2; uVar6 < (ulong)(((long)pVVar7 - (long)pVVar4) / 0x18); uVar6 = uVar6 + 1) {
      lVar1 = *(long *)&pVVar4[uVar6].super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>;
      *(double *)(lVar1 + uVar8 * 8) =
           *(double *)(lVar1 + uVar8 * 8) /
           *(double *)
            (*(long *)&pVVar4[uVar8].super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_> + uVar8 * 8);
      for (uVar5 = uVar2; sVar3 = Matrix_Dense<double,_0UL,_0UL>::size_column(this_00),
          uVar5 < sVar3; uVar5 = uVar5 + 1) {
        pVVar4 = (this_00->
                 super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ).
                 super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar1 = *(long *)&pVVar4[uVar6].super_vector<double,_std::allocator<double>_>.
                          super__Vector_base<double,_std::allocator<double>_>;
        *(double *)(lVar1 + uVar5 * 8) =
             *(double *)(lVar1 + uVar5 * 8) -
             *(double *)(lVar1 + uVar8 * 8) *
             *(double *)
              (*(long *)&pVVar4[uVar8].super_vector<double,_std::allocator<double>_>.
                         super__Vector_base<double,_std::allocator<double>_> + uVar5 * 8);
      }
      pVVar4 = (this->lu_factorised).
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar7 = (this->lu_factorised).
               super_vector<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               .
               super__Vector_base<Disa::Vector_Dense<double,_0UL>,_std::allocator<Disa::Vector_Dense<double,_0UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  this->factorised = true;
LAB_0010c0c8:
  return uVar2 <= uVar8;
}

Assistant:

bool Direct_Lower_Upper_Factorisation<_solver_type, _size, _pivot>::factorise(
const Matrix_Dense<Scalar, _size, _size>& a_matrix) {

  // Initialise factorisation data.
  factorised = false;
  lu_factorised = a_matrix;
  if(_pivot) {
    pivots.resize(lu_factorised.size_column());
    std::iota(pivots.begin(), pivots.end(), 0);
  }

  // Factorise A into L and U.
  for(std::size_t i_row = 0; i_row < lu_factorised.size_row(); ++i_row) {

    // Pivoting
    if(_pivot) {

      // Find largest remaining column value to pivot on.
      Scalar max = 0.0;
      std::size_t i_max = i_row;
      for(std::size_t i_row_sweep = i_row; i_row_sweep < lu_factorised.size_column(); ++i_row_sweep) {
        const Scalar absA = std::abs(lu_factorised[i_row_sweep][i_row]);
        if(is_nearly_greater(absA, max)) {
          max = absA;
          i_max = i_row_sweep;
        }
      }

      // Pivot if larger value found.
      if(i_max != i_row) {
        std::swap(pivots[i_row], pivots[i_max]);
        std::swap(lu_factorised[i_row], lu_factorised[i_max]);
      }
    }

    // Check degeneracy.
    if(std::abs(lu_factorised[i_row][i_row]) < factorisation_tolerance) return false;

    // Decomposition, actual factorisation to compute L and U.
    for(std::size_t i_row_sweep = i_row + 1; i_row_sweep < lu_factorised.size_row(); ++i_row_sweep) {
      lu_factorised[i_row_sweep][i_row] /= lu_factorised[i_row][i_row];

      for(std::size_t i_column_sweep = i_row + 1; i_column_sweep < lu_factorised.size_column(); ++i_column_sweep)
        lu_factorised[i_row_sweep][i_column_sweep] -=
        lu_factorised[i_row_sweep][i_row] * lu_factorised[i_row][i_column_sweep];
    }
  }

  factorised = true;
  return true;
}